

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::BiasParameter::Clear(BiasParameter *this)

{
  bool bVar1;
  LogMessage *other;
  LogFinisher local_8d [20];
  byte local_79;
  LogMessage local_78;
  BiasParameter *local_40;
  BiasParameter *this_local;
  InternalMetadataWithArena *local_30;
  InternalMetadataWithArena *local_28;
  undefined4 local_1c;
  HasBits<1UL> *local_18;
  InternalMetadataWithArena *local_10;
  
  local_18 = &this->_has_bits_;
  local_1c = 0;
  local_40 = this;
  if ((local_18->has_bits_[0] & 7) != 0) {
    bVar1 = has_filler(this);
    if (bVar1) {
      local_79 = 0;
      if (this->filler_ == (FillerParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_78,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x509c);
        local_79 = 1;
        other = google::protobuf::internal::LogMessage::operator<<
                          (&local_78,"CHECK failed: filler_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(local_8d,other);
      }
      if ((local_79 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_78);
      }
      FillerParameter::Clear(this->filler_);
    }
    this->axis_ = 1;
    this->num_axes_ = 1;
  }
  this_local = (BiasParameter *)&this->_has_bits_;
  memset(this_local,0,4);
  local_30 = &this->_internal_metadata_;
  if (((uint)(local_30->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_28 = local_30;
    local_10 = local_30;
    google::protobuf::internal::InternalMetadataWithArena::DoClear(local_30);
  }
  return;
}

Assistant:

void BiasParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.BiasParameter)
  if (_has_bits_[0 / 32] & 7u) {
    if (has_filler()) {
      GOOGLE_DCHECK(filler_ != NULL);
      filler_->::caffe::FillerParameter::Clear();
    }
    axis_ = 1;
    num_axes_ = 1;
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}